

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  string *psVar1;
  TestProperty *pTVar2;
  size_t sVar3;
  pointer *__ptr;
  int i;
  char *__s;
  ostream *poVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  allocator local_79;
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = __return_storage_ptr__;
  Message::Message((Message *)&local_88);
  if (0 < (int)((ulong)((long)this[1].super_EmptyTestEventListener.super_TestEventListener.
                              _vptr_TestEventListener -
                       *(long *)((long)&(this->output_file_).field_2 + 8)) >> 6)) {
    i = 0;
    do {
      pTVar2 = TestResult::GetTestProperty((TestResult *)this,i);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10)," ",1);
      __s = (pTVar2->key_)._M_dataplus._M_p;
      poVar4 = (ostream *)(local_88._M_head_impl + 0x10);
      if (__s == (char *)0x0) {
        sVar3 = 6;
        __s = "(null)";
      }
      else {
        sVar3 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"=",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\"",1);
      std::__cxx11::string::string((string *)&local_50,(pTVar2->value_)._M_dataplus._M_p,&local_79);
      EscapeXml(&local_70,&local_50,true);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),local_70._M_dataplus._M_p,
                 local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88._M_head_impl + 0x10),"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)this[1].super_EmptyTestEventListener.super_TestEventListener.
                                     _vptr_TestEventListener -
                              *(long *)((long)&(this->output_file_).field_2 + 8)) >> 6));
  }
  psVar1 = local_78;
  StringStreamToString(local_78,local_88._M_head_impl);
  if (local_88._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  return psVar1;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}